

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

int adios2sys::SystemTools::EstimateFormatLength(char *format,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  size_t sVar5;
  byte bVar6;
  
  if (format == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    sVar3 = strlen(format);
    while( true ) {
      iVar2 = (int)sVar3;
      bVar6 = *format;
      if (bVar6 == 0) break;
      format = (char *)((byte *)format + 1);
      if (bVar6 == 0x25) {
        bVar6 = *format;
        sVar5 = sVar3;
        if (bVar6 != 0x25) {
          while( true ) {
            iVar2 = isalpha((int)(char)bVar6);
            if (iVar2 != 0) break;
            bVar6 = ((byte *)format)[1];
            format = (char *)((byte *)format + 1);
          }
          if (bVar6 - 0x65 < 3) {
            if (ap->fp_offset < 0xa1) {
              ap->fp_offset = ap->fp_offset + 0x10;
              sVar5 = sVar3 + 0x40;
            }
            else {
LAB_006b1482:
              ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
              sVar5 = sVar3 + 0x40;
            }
          }
          else if (bVar6 == 0x73) {
            uVar1 = ap->gp_offset;
            if ((ulong)uVar1 < 0x29) {
              puVar4 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
              ap->gp_offset = uVar1 + 8;
            }
            else {
              puVar4 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar4 + 1;
            }
            if ((char *)*puVar4 != (char *)0x0) {
              sVar5 = strlen((char *)*puVar4);
              sVar5 = sVar3 + sVar5;
            }
          }
          else {
            sVar5 = sVar3 + 0x40;
            if (0x28 < ap->gp_offset) goto LAB_006b1482;
            ap->gp_offset = ap->gp_offset + 8;
          }
        }
        format = (char *)((byte *)format + 1);
        sVar3 = sVar5;
      }
    }
  }
  return iVar2;
}

Assistant:

int SystemTools::EstimateFormatLength(const char* format, va_list ap)
{
  if (!format) {
    return 0;
  }

  // Quick-hack attempt at estimating the length of the string.
  // Should never under-estimate.

  // Start with the length of the format string itself.

  size_t length = strlen(format);

  // Increase the length for every argument in the format.

  const char* cur = format;
  while (*cur) {
    if (*cur++ == '%') {
      // Skip "%%" since it doesn't correspond to a va_arg.
      if (*cur != '%') {
        while (!int(isalpha(*cur))) {
          ++cur;
        }
        switch (*cur) {
          case 's': {
            // Check the length of the string.
            char* s = va_arg(ap, char*);
            if (s) {
              length += strlen(s);
            }
          } break;
          case 'e':
          case 'f':
          case 'g': {
            // Assume the argument contributes no more than 64 characters.
            length += 64;

            // Eat the argument.
            static_cast<void>(va_arg(ap, double));
          } break;
          default: {
            // Assume the argument contributes no more than 64 characters.
            length += 64;

            // Eat the argument.
            static_cast<void>(va_arg(ap, int));
          } break;
        }
      }

      // Move past the characters just tested.
      ++cur;
    }
  }

  return static_cast<int>(length);
}